

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O0

size_t obj_desc_name_format(char *buf,size_t max,size_t end,char *fmt,char *modstr,_Bool pluralise)

{
  char cVar1;
  char *__s;
  bool bVar2;
  char *local_58;
  char *endmark;
  char *plural;
  char *singular;
  char prev;
  _Bool pluralise_local;
  char *modstr_local;
  char *fmt_local;
  size_t end_local;
  size_t max_local;
  char *buf_local;
  
  modstr_local = fmt;
  fmt_local = (char *)end;
  end_local = max;
  max_local = (size_t)buf;
  do {
    while( true ) {
      while( true ) {
        if (*modstr_local == '\0') {
          fmt_local[max_local] = '\0';
          return (size_t)fmt_local;
        }
        if (*modstr_local != '&') break;
        while( true ) {
          bVar2 = true;
          if (*modstr_local != ' ') {
            bVar2 = *modstr_local == '&';
          }
          if (!bVar2) break;
          modstr_local = modstr_local + 1;
        }
      }
      if (*modstr_local == '~') break;
      if (*modstr_local == '|') {
        __s = modstr_local + 1;
        endmark = strchr(__s,0x7c);
        local_58 = (char *)0x0;
        if (endmark != (char *)0x0) {
          endmark = endmark + 1;
          local_58 = strchr(endmark,0x7c);
        }
        if (((__s == (char *)0x0) || (endmark == (char *)0x0)) || (local_58 == (char *)0x0)) {
          return (size_t)fmt_local;
        }
        if (pluralise) {
          strnfcat((char *)max_local,end_local,(size_t *)&fmt_local,"%.*s",
                   (ulong)(uint)((int)local_58 - (int)endmark),endmark);
        }
        else {
          strnfcat((char *)max_local,end_local,(size_t *)&fmt_local,"%.*s",
                   (ulong)(((int)endmark - (int)__s) - 1),__s);
        }
        modstr_local = local_58;
      }
      else if (*modstr_local == '#') {
        fmt_local = (char *)obj_desc_name_format
                                      ((char *)max_local,end_local,(size_t)fmt_local,modstr,
                                       (char *)0x0,pluralise);
      }
      else {
        fmt_local[max_local] = *modstr_local;
        fmt_local = fmt_local + 1;
      }
LAB_001b9807:
      modstr_local = modstr_local + 1;
    }
    cVar1 = modstr_local[-1];
    if (pluralise) {
      if (((cVar1 == 's') || (cVar1 == 'h')) || (cVar1 == 'x')) {
        strnfcat((char *)max_local,end_local,(size_t *)&fmt_local,"es");
      }
      else {
        strnfcat((char *)max_local,end_local,(size_t *)&fmt_local,"s");
      }
      goto LAB_001b9807;
    }
    modstr_local = modstr_local + 1;
  } while( true );
}

Assistant:

size_t obj_desc_name_format(char *buf, size_t max, size_t end,
		const char *fmt, const char *modstr, bool pluralise)
{
	/* Copy the string */
	while (*fmt) {
		/* Skip */
		if (*fmt == '&') {
			while (*fmt == ' ' || *fmt == '&')
				fmt++;
			continue;
		} else if (*fmt == '~') {
			/* Pluralizer (regular English plurals) */
			char prev = *(fmt - 1);

			if (!pluralise)	{
				fmt++;
				continue;
			}

			/* e.g. cutlass-e-s, torch-e-s, box-e-s */
			if (prev == 's' || prev == 'h' || prev == 'x')
				strnfcat(buf, max, &end, "es");
			else
				strnfcat(buf, max, &end, "s");
		} else if (*fmt == '|') {
			/* Special plurals 
			* e.g. kni|fe|ves|
			*          ^  ^  ^ */
			const char *singular = fmt + 1;
			const char *plural   = strchr(singular, '|');
			const char *endmark  = NULL;

			if (plural) {
				plural++;
				endmark = strchr(plural, '|');
			}

			if (!singular || !plural || !endmark) return end;

			if (!pluralise)
				strnfcat(buf, max, &end, "%.*s",
					(int) (plural - singular) - 1,
					singular);
			else
				strnfcat(buf, max, &end, "%.*s",
					(int) (endmark - plural), plural);

			fmt = endmark;
		} else if (*fmt == '#') {
			/* Add modstr, with pluralisation if relevant */
			end = obj_desc_name_format(buf, max, end, modstr, NULL,	pluralise);
		}

		else
			buf[end++] = *fmt;

		fmt++;
	}

	buf[end] = 0;

	return end;
}